

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

void Sfm_TimNodeArrival(Sfm_Tim_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  int *pTimeOut_00;
  int *piVar2;
  int *pTimeOut;
  int *pTimesIn [6];
  int local_1c;
  int iFanin;
  int i;
  Abc_Obj_t *pNode_local;
  Sfm_Tim_t *p_local;
  
  pTimeOut_00 = Sfm_TimArr(p,pNode);
  iVar1 = Abc_ObjFaninNum(pNode);
  if (6 < iVar1) {
    __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                  ,0x67,"void Sfm_TimNodeArrival(Sfm_Tim_t *, Abc_Obj_t *)");
  }
  for (local_1c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Abc_ObjFaninId(pNode,local_1c);
    piVar2 = Sfm_TimArrId(p,iVar1);
    pTimesIn[(long)local_1c + -1] = piVar2;
  }
  Sfm_TimGateArrival(p,(Mio_Gate_t *)(pNode->field_5).pData,&pTimeOut,pTimeOut_00);
  return;
}

Assistant:

static inline void Sfm_TimNodeArrival( Sfm_Tim_t * p, Abc_Obj_t * pNode )
{
    int i, iFanin, * pTimesIn[6];
    int * pTimeOut = Sfm_TimArr(p, pNode);
    assert( Abc_ObjFaninNum(pNode) <= 6 );
    Abc_ObjForEachFaninId( pNode, iFanin, i )
        pTimesIn[i] = Sfm_TimArrId( p, iFanin );
    Sfm_TimGateArrival( p, (Mio_Gate_t *)pNode->pData, pTimesIn, pTimeOut );
}